

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O1

void __thiscall
timertt::details::
basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
::
activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
           *this,duration<long,_std::ratio<1L,_1000000000L>_> pause,
          duration<long,_std::ratio<1L,_1000000000L>_> period,timer_action *action)

{
  reference_counter_type *prVar1;
  _Manager_type p_Var2;
  timer_holder local_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  local_50.m_timer = (timer_object<timertt::thread_safety::unsafe> *)operator_new(0x48);
  (local_50.m_timer)->_vptr_timer_object = (_func_int **)0x0;
  *(undefined8 *)&(local_50.m_timer)->m_references = 0;
  local_50.m_timer[1]._vptr_timer_object = (_func_int **)0x0;
  *(undefined8 *)&local_50.m_timer[1].m_references = 0;
  local_50.m_timer[2]._vptr_timer_object = (_func_int **)0x0;
  *(undefined8 *)&local_50.m_timer[2].m_references = 0;
  local_50.m_timer[3]._vptr_timer_object = (_func_int **)0x0;
  *(undefined8 *)&local_50.m_timer[3].m_references = 0;
  local_50.m_timer[4]._vptr_timer_object = (_func_int **)0x0;
  (local_50.m_timer)->m_references = 0;
  (local_50.m_timer)->_vptr_timer_object = (_func_int **)&PTR__timer_type_00289de8;
  local_50.m_timer[1]._vptr_timer_object = (_func_int **)0x0;
  *(undefined1 (*) [32])(local_50.m_timer + 2) = ZEXT432(0) << 0x40;
  (local_50.m_timer)->m_references = 1;
  local_38 = (_Manager_type)0x0;
  local_30 = action->_M_invoker;
  p_Var2 = (action->super__Function_base)._M_manager;
  local_48 = (_Any_data)(ZEXT416(0) << 0x40);
  if (p_Var2 != (_Manager_type)0x0) {
    local_48 = (action->super__Function_base)._M_functor;
    *(undefined1 (*) [16])&(action->super__Function_base)._M_manager = ZEXT416(0) << 0x40;
    local_38 = p_Var2;
  }
  activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (this,&local_50,pause,period,(timer_action *)&local_48);
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_50.m_timer != (timer_object<timertt::thread_safety::unsafe> *)0x0) {
    prVar1 = &(local_50.m_timer)->m_references;
    *prVar1 = *prVar1 - 1;
    if (*prVar1 == 0) {
      (*(local_50.m_timer)->_vptr_timer_object[1])();
    }
  }
  return;
}

Assistant:

void
	activate(
		//! Pause for timer execution.
		DURATION_1 pause,
		//! Repetition period.
		//! If <tt>DURATION_2::zero() == period</tt> then timer will be
		//! single-shot.
		DURATION_2 period,
		//! Action for the timer.
		timer_action action )
	{
		activate( allocate(), pause, period, std::move( action ) );
	}